

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio-logger.cpp
# Opt level: O2

void __thiscall AudioLogger::Data::Data(Data *this)

{
  long lVar1;
  ulong in_RAX;
  long lVar2;
  undefined8 local_28;
  
  this->deviceIdIn = 0;
  this->sampleSize_bytes = -1;
  this->bufferId = 0;
  this->nRecords = 0;
  local_28 = in_RAX;
  memset(&this->records,0,0x1a0);
  (this->parameters).captureId = -1;
  (this->parameters).nChannels = -1;
  *(undefined4 *)&(this->parameters).sampleRate = 0xffffffff;
  *(undefined4 *)((long)&(this->parameters).sampleRate + 4) = 0xffffffff;
  (this->parameters).sampleType = F32SYS;
  (this->parameters).filter = FirstOrderHighPass;
  (this->parameters).freqCutoff_Hz = 1000.0;
  (this->filterCoefficients).a0 = 0.0;
  (this->filterCoefficients).a1 = 0.0;
  (this->filterCoefficients).a2 = 0.0;
  (this->filterCoefficients).b1 = 0.0;
  (this->filterCoefficients).b2 = 0.0;
  (this->filterCoefficients).c0 = 0.0;
  (this->filterCoefficients).d0 = 0.0;
  (this->filterCoefficients).xnz1 = 0.0;
  (this->filterCoefficients).xnz1 = 0.0;
  (this->filterCoefficients).xnz2 = 0.0;
  (this->filterCoefficients).ynz1 = 0.0;
  (this->filterCoefficients).ynz2 = 0.0;
  *(undefined1 (*) [16])&(this->mutex).super___mutex_base._M_mutex = (undefined1  [16])0x0;
  *(undefined1 (*) [16])((long)&(this->mutex).super___mutex_base._M_mutex + 0x10) =
       (undefined1  [16])0x0;
  *(undefined1 (*) [16])((long)&(this->mutex).super___mutex_base._M_mutex.__data.__list.__prev + 1)
       = (undefined1  [16])0x0;
  for (lVar2 = 0xc; lVar2 != 0x1d580c; lVar2 = lVar2 + 0x800) {
    local_28 = local_28 & 0xffffffff00000000;
    std::array<float,_512UL>::fill
              ((array<float,_512UL> *)((long)(this->buffer)._M_elems[0]._M_elems + lVar2 + -0xc),
               (value_type_conflict3 *)&local_28);
  }
  for (lVar2 = 0; lVar2 != 0x180; lVar2 = lVar2 + 0x18) {
    lVar1 = *(long *)((long)&(this->records)._M_elems[0].
                             super__Vector_base<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar2);
    if (*(long *)((long)&(this->records)._M_elems[0].
                         super__Vector_base<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish + lVar2) != lVar1) {
      *(long *)((long)&(this->records)._M_elems[0].
                       super__Vector_base<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish + lVar2) = lVar1;
    }
  }
  local_28 = local_28 & 0xffffffff;
  std::array<int,_16UL>::fill(&this->nFramesToRecord,(value_type_conflict2 *)((long)&local_28 + 4));
  return;
}

Assistant:

Data() : isReady(false) {
        for (auto & frame : buffer) {
            frame.fill(0);
        }

        for (auto & record : records) {
            record.clear();
        }

        nFramesToRecord.fill(0);
    }